

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

int Cudd_zddVarsFromBddVars(DdManager *dd,int multiplicity)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  MtrNode *treenode;
  char *vmask;
  char *lmask;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  
  if (multiplicity < 1) {
    return 0;
  }
  uVar6 = (ulong)(uint)multiplicity;
  iVar3 = dd->sizeZ;
  iVar8 = dd->size * multiplicity;
  if ((iVar3 < iVar8) && (iVar8 = cuddResizeTableZdd(dd,iVar8 + -1), iVar8 == 0)) {
    return 0;
  }
  if (iVar3 == 0) {
    lVar5 = 0;
    lVar10 = 0;
    for (lVar11 = 0; lVar11 < dd->size; lVar11 = lVar11 + 1) {
      piVar4 = dd->perm;
      piVar12 = dd->invpermZ;
      piVar2 = dd->permZ;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        iVar3 = piVar4[lVar11] * multiplicity + (int)uVar7;
        *(int *)((long)piVar2 + uVar7 * 4 + lVar10) = iVar3;
        piVar12[iVar3] = (int)lVar5 + (int)uVar7;
      }
      lVar10 = lVar10 + uVar6 * 4;
      lVar5 = lVar5 + uVar6;
    }
    uVar7 = 0;
    uVar6 = (ulong)(uint)dd->sizeZ;
    if (dd->sizeZ < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      dd->univ[uVar7]->index = dd->invpermZ[uVar7];
    }
  }
  else {
    iVar3 = dd->sizeZ;
    piVar4 = (int *)malloc((long)iVar3 * 4);
    if (piVar4 == (int *)0x0) goto LAB_00660bf5;
    uVar1 = dd->size;
    uVar7 = 0;
    uVar9 = 0;
    piVar12 = piVar4;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
      piVar2 = dd->invperm;
      for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
        piVar12[uVar13] = piVar2[uVar7] * multiplicity + (int)uVar13;
      }
      piVar12 = piVar12 + uVar6;
    }
    for (lVar5 = (long)(int)(uVar1 * multiplicity); lVar5 < iVar3; lVar5 = lVar5 + 1) {
      piVar4[lVar5] = (int)lVar5;
    }
    iVar3 = Cudd_zddShuffleHeap(dd,piVar4);
    free(piVar4);
    if (iVar3 == 0) {
      return 0;
    }
  }
  if (dd->treeZ != (MtrNode *)0x0) {
    Cudd_FreeZddTree(dd);
  }
  if (dd->tree == (MtrNode *)0x0) {
    if (multiplicity == 1) {
      return 1;
    }
    treenode = Mtr_InitGroupTree(0,dd->sizeZ);
    dd->treeZ = treenode;
    if (treenode == (MtrNode *)0x0) {
      return 0;
    }
    treenode->index = *dd->invpermZ;
  }
  else {
    treenode = Mtr_CopyTree(dd->tree,multiplicity);
    dd->treeZ = treenode;
    if (treenode == (MtrNode *)0x0) {
      return 0;
    }
    if (multiplicity == 1) {
      return 1;
    }
  }
  uVar1 = dd->size;
  vmask = (char *)malloc((long)(int)uVar1);
  if ((vmask != (char *)0x0) && (lmask = (char *)malloc((long)(int)uVar1), lmask != (char *)0x0)) {
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      lmask[uVar6] = '\0';
      vmask[uVar6] = '\0';
    }
    iVar3 = addMultiplicityGroups(dd,treenode,multiplicity,vmask,lmask);
    free(vmask);
    free(lmask);
    return (uint)(iVar3 != 0);
  }
LAB_00660bf5:
  dd->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
Cudd_zddVarsFromBddVars(
  DdManager * dd /* DD manager */,
  int multiplicity /* how many ZDD variables are created for each BDD variable */)
{
    int res;
    int i, j;
    int allnew;
    int *permutation;

    if (multiplicity < 1) return(0);
    allnew = dd->sizeZ == 0;
    if (dd->size * multiplicity > dd->sizeZ) {
        res = cuddResizeTableZdd(dd,dd->size * multiplicity - 1);
        if (res == 0) return(0);
    }
    /* Impose the order of the BDD variables to the ZDD variables. */
    if (allnew) {
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                dd->permZ[i * multiplicity + j] =
                    dd->perm[i] * multiplicity + j;
                dd->invpermZ[dd->permZ[i * multiplicity + j]] =
                    i * multiplicity + j;
            }
        }
        for (i = 0; i < dd->sizeZ; i++) {
            dd->univ[i]->index = dd->invpermZ[i];
        }
    } else {
        permutation = ABC_ALLOC(int,dd->sizeZ);
        if (permutation == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                permutation[i * multiplicity + j] =
                    dd->invperm[i] * multiplicity + j;
            }
        }
        for (i = dd->size * multiplicity; i < dd->sizeZ; i++) {
            permutation[i] = i;
        }
        res = Cudd_zddShuffleHeap(dd, permutation);
        ABC_FREE(permutation);
        if (res == 0) return(0);
    }
    /* Copy and expand the variable group tree if it exists. */
    if (dd->treeZ != NULL) {
        Cudd_FreeZddTree(dd);
    }
    if (dd->tree != NULL) {
        dd->treeZ = Mtr_CopyTree(dd->tree, multiplicity);
        if (dd->treeZ == NULL) return(0);
    } else if (multiplicity > 1) {
        dd->treeZ = Mtr_InitGroupTree(0, dd->sizeZ);
        if (dd->treeZ == NULL) return(0);
        dd->treeZ->index = dd->invpermZ[0];
    }
    /* Create groups for the ZDD variables derived from the same BDD variable.
    */
    if (multiplicity > 1) {
        char *vmask, *lmask;

        vmask = ABC_ALLOC(char, dd->size);
        if (vmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        lmask =  ABC_ALLOC(char, dd->size);
        if (lmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            vmask[i] = lmask[i] = 0;
        }
        res = addMultiplicityGroups(dd,dd->treeZ,multiplicity,vmask,lmask);
        ABC_FREE(vmask);
        ABC_FREE(lmask);
        if (res == 0) return(0);
    }
    return(1);

}